

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

bool __thiscall
mp::internal::SolverAppOptionParser::ShowSolverOptionsASL::OptionASLNameLess::operator()
          (OptionASLNameLess *this,SolverOption *lhs,SolverOption *rhs)

{
  int iVar1;
  char *__s1;
  char *__s2;
  int cmp;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  __s1 = SolverOption::name_ASL
                   ((SolverOption *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  __s2 = SolverOption::name_ASL
                   ((SolverOption *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  iVar1 = strcasecmp(__s1,__s2);
  return iVar1 < 0;
}

Assistant:

bool operator()(
      const SolverOption* lhs, const SolverOption* rhs) const {
      int cmp = strcasecmp(lhs->name_ASL(), rhs->name_ASL());
      return cmp < 0;
    }